

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_snode(lyout *out,int level,lys_node *node,int mask)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  char *__s;
  long lVar4;
  lys_node *__s_00;
  long lVar5;
  int iVar6;
  int iVar7;
  lys_module *plVar8;
  lys_module *plVar9;
  char *pcVar10;
  lys_node *plVar11;
  char *pcVar12;
  lys_node *plVar13;
  LYS_NODE LVar14;
  char *pcVar15;
  lyout *plVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int local_4c;
  lyout *plStack_48;
  int content_1;
  lys_node *local_40;
  int local_34 [2];
  int content;
  
  LVar14 = mask & node->nodetype;
  plStack_48 = out;
  local_40 = node;
  if (0xff < (int)LVar14) {
    if ((int)LVar14 < 0x800) {
      if (LVar14 != LYS_RPC) {
        if ((LVar14 != LYS_INPUT) && (LVar14 != LYS_OUTPUT)) {
          return;
        }
        pcVar15 = "output";
        ly_print(out,"%*s<%s",(ulong)(uint)(level * 2),"");
        ly_print(out,">\n");
        iVar6 = level + 1;
        if (local_40->ext_size != 0) {
          yin_print_extension_instances
                    (out,iVar6,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                     (uint)local_40->ext_size);
        }
        if (local_40->padding[1] != '\0') {
          lVar17 = 0;
          uVar19 = 0;
          do {
            yin_print_must(out,iVar6,local_40->module,(lys_restr *)(local_40[1].name + lVar17));
            uVar19 = uVar19 + 1;
            lVar17 = lVar17 + 0x38;
          } while (uVar19 < local_40->padding[1]);
        }
        if (*(short *)(local_40->padding + 2) != 0) {
          lVar17 = 0;
          uVar19 = 0;
          do {
            yin_print_typedef(out,iVar6,local_40->module,
                              (lys_tpdf *)(*(long *)local_40->hash + lVar17));
            uVar19 = uVar19 + 1;
            lVar17 = lVar17 + 0x80;
          } while (uVar19 < *(ushort *)(local_40->padding + 2));
        }
        plVar13 = local_40;
        for (plVar11 = local_40->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
          if (plVar11->parent == plVar13) {
            yin_print_snode(out,iVar6,plVar11,0x800);
            plVar13 = local_40;
          }
        }
        for (plVar11 = plVar13->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
          if (plVar11->parent == plVar13) {
            yin_print_snode(out,iVar6,plVar11,0x903f);
            plVar13 = local_40;
          }
        }
        if (plVar13->nodetype == LYS_INPUT) {
          pcVar15 = "input";
        }
        uVar19 = (ulong)(uint)(level * 2);
        goto LAB_001915b1;
      }
    }
    else {
      if ((int)LVar14 < 0x4000) {
        if (LVar14 == LYS_GROUPING) {
          local_34[0] = 0;
          yin_print_open(out,level,(char *)0x0,"grouping","name",node->name,0);
          iVar6 = level + 1;
          yin_print_snode_common(out,iVar6,local_40,local_40->module,local_34,0x71);
          if (*(short *)(local_40->padding + 2) != 0) {
            lVar17 = 0;
            uVar19 = 0;
            do {
              if (local_34[0] == 0) {
                local_34[0] = 1;
                ly_print(plStack_48,">\n");
              }
              yin_print_typedef(plStack_48,iVar6,local_40->module,
                                (lys_tpdf *)(*(long *)local_40->hash + lVar17));
              uVar19 = uVar19 + 1;
              lVar17 = lVar17 + 0x80;
            } while (uVar19 < *(ushort *)(local_40->padding + 2));
          }
          plVar16 = plStack_48;
          for (plVar11 = local_40->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(plVar16,">\n");
            }
            yin_print_snode(plVar16,iVar6,plVar11,0x800);
          }
          for (plVar11 = local_40->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(plVar16,">\n");
            }
            yin_print_snode(plVar16,iVar6,plVar11,0x903f);
          }
          for (plVar11 = local_40->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
            if (local_34[0] == 0) {
              local_34[0] = 1;
              ly_print(plVar16,">\n");
            }
            yin_print_snode(plVar16,iVar6,plVar11,0x4000);
          }
          plVar16 = plStack_48;
          iVar7 = local_34[0];
          for (plVar11 = local_40->child; plStack_48 = plVar16, local_34[0] = iVar7,
              plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
            if (iVar7 == 0) {
              local_34[0] = 1;
              ly_print(plVar16,">\n");
            }
            yin_print_snode(plStack_48,iVar6,plVar11,0x80);
            plVar16 = plStack_48;
            iVar7 = local_34[0];
          }
          pcVar15 = "grouping";
        }
        else {
          if (LVar14 != LYS_USES) {
            return;
          }
          local_4c = 0;
          ly_print(out,"%*s<uses name=\"",(ulong)(uint)(level * 2),"");
          if (local_40->child != (lys_node *)0x0) {
            plVar8 = lys_node_module(local_40->child);
            plVar9 = lys_node_module(local_40);
            if (plVar9 != plVar8) {
              pcVar15 = transform_module_name2import_prefix(local_40->module,plVar8->name);
              ly_print(out,"%s:",pcVar15);
            }
          }
          ly_print(out,"%s\"",local_40->name);
          iVar6 = level + 1;
          yin_print_snode_common(out,iVar6,local_40,local_40->module,&local_4c,1);
          lVar17._0_1_ = local_40->hash[0];
          lVar17._1_1_ = local_40->hash[1];
          lVar17._2_1_ = local_40->hash[2];
          lVar17._3_1_ = local_40->hash[3];
          lVar17._4_4_ = *(undefined4 *)&local_40->field_0x6c;
          if (lVar17 != 0) {
            if (local_4c == 0) {
              local_4c = 1;
              ly_print(plStack_48,">\n");
            }
            out = plStack_48;
            yin_print_when(plStack_48,iVar6,local_40->module,*(lys_when **)local_40->hash);
          }
          yin_print_snode_common(out,iVar6,local_40,local_40->module,&local_4c,0x72);
          if (local_40->padding[2] != '\0') {
            iVar7 = level + 2;
            uVar19 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(plStack_48,">\n");
              }
              plVar8 = local_40->module;
              pcVar15 = local_40[1].name;
              lVar17 = uVar19 * 0x50;
              plVar11 = (lys_node *)(pcVar15 + lVar17);
              local_34[0] = 0;
              pcVar10 = transform_json2xml(plVar8,*(char **)(pcVar15 + lVar17),0,(char ***)0x0,
                                           (char ***)0x0,(uint32_t *)0x0);
              yin_print_open(plStack_48,iVar6,(char *)0x0,"refine","target-node",pcVar10,local_34[0]
                            );
              lydict_remove(plVar8->ctx,pcVar10);
              yin_print_snode_common(plStack_48,iVar7,plVar11,plVar8,local_34,3);
              if (pcVar15[lVar17 + 0x1e] != '\0') {
                lVar17 = 0;
                uVar18 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plStack_48,">\n");
                  }
                  yin_print_must(plStack_48,iVar7,plVar8,
                                 (lys_restr *)(*(long *)&plVar11->nodetype + lVar17));
                  uVar18 = uVar18 + 1;
                  lVar17 = lVar17 + 0x38;
                } while (uVar18 < plVar11->padding[2]);
              }
              plVar16 = plStack_48;
              if ((*(short *)plVar11->padding == 1) && (plVar11->child != (lys_node *)0x0)) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plStack_48,">\n");
                }
                yin_print_substmt(plVar16,iVar7,LYEXT_SUBSTMT_PRESENCE,'\0',(char *)plVar11->child,
                                  plVar8,plVar11->ext,(uint)plVar11->ext_size);
              }
              if (plVar11->padding[3] != '\0') {
                uVar18 = 0;
                do {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar16,">\n");
                  }
                  yin_print_substmt(plVar16,iVar7,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar18,
                                    *(char **)(plVar11->parent->padding + uVar18 * 8 + -0x1c),plVar8
                                    ,plVar11->ext,(uint)plVar11->ext_size);
                  uVar18 = uVar18 + 1;
                } while (uVar18 < plVar11->padding[3]);
              }
              if ((plVar11->flags & 1) == 0) {
                if ((plVar11->flags & 2) != 0) {
                  pcVar15 = "false";
                  goto joined_r0x0018faf9;
                }
              }
              else {
                pcVar15 = "true";
joined_r0x0018faf9:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_substmt(plVar16,iVar7,LYEXT_SUBSTMT_CONFIG,'\0',pcVar15,plVar8,
                                  plVar11->ext,(uint)plVar11->ext_size);
              }
              if ((plVar11->flags & 0x40) == 0) {
                if ((char)plVar11->flags < '\0') {
                  pcVar15 = "false";
                  goto joined_r0x0018fb62;
                }
              }
              else {
                pcVar15 = "true";
joined_r0x0018fb62:
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  ly_print(plVar16,">\n");
                }
                yin_print_substmt(plVar16,iVar7,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar15,plVar8,
                                  plVar11->ext,(uint)plVar11->ext_size);
              }
              if ((plVar11->padding[0] & 0x18) != 0) {
                if ((plVar11->flags & 0x10) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar16,">\n");
                  }
                  yin_print_unsigned(plVar16,iVar7,LYEXT_SUBSTMT_MIN,'\0',plVar8,plVar11->ext,
                                     (uint)plVar11->ext_size,*(uint *)&plVar11->child);
                }
                if ((plVar11->flags & 8) != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar16,">\n");
                  }
                  uVar2 = *(uint *)((long)&plVar11->child + 4);
                  if (uVar2 == 0) {
                    yin_print_substmt(plVar16,iVar7,LYEXT_SUBSTMT_MAX,'\0',"unbounded",plVar8,
                                      plVar11->ext,(uint)plVar11->ext_size);
                  }
                  else {
                    yin_print_unsigned(plVar16,iVar7,LYEXT_SUBSTMT_MAX,'\0',plVar8,plVar11->ext,
                                       (uint)plVar11->ext_size,uVar2);
                  }
                }
              }
              yin_print_snode_common(plVar16,iVar7,plVar11,plVar8,local_34,0x60);
              yin_print_close(plVar16,iVar6,(char *)0x0,"refine",local_34[0]);
              uVar19 = uVar19 + 1;
            } while (uVar19 < local_40->padding[2]);
          }
          if (local_40->padding[3] != '\0') {
            lVar17 = 0;
            uVar19 = 0;
            do {
              if (local_4c == 0) {
                local_4c = 1;
                ly_print(plStack_48,">\n");
              }
              yin_print_augment(plStack_48,iVar6,local_40->module,
                                (lys_node_augment *)(local_40[1].dsc + lVar17));
              uVar19 = uVar19 + 1;
              lVar17 = lVar17 + 0x68;
            } while (uVar19 < local_40->padding[3]);
          }
          pcVar15 = "uses";
          plVar16 = plStack_48;
          iVar7 = local_4c;
        }
        goto LAB_0019148c;
      }
      if (LVar14 != LYS_ACTION) {
        if (LVar14 != LYS_ANYDATA) {
          return;
        }
        goto LAB_0018fe97;
      }
    }
    local_34[0] = 0;
    pcVar15 = "action";
    pcVar10 = "action";
    if (node->nodetype == LYS_RPC) {
      pcVar10 = "rpc";
    }
    yin_print_open(out,level,(char *)0x0,pcVar10,"name",node->name,0);
    iVar6 = level + 1;
    yin_print_snode_common(out,iVar6,local_40,local_40->module,local_34,0x73);
    if (*(short *)(local_40->padding + 2) != 0) {
      lVar17 = 0;
      uVar19 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_typedef(plStack_48,iVar6,local_40->module,(lys_tpdf *)(local_40[1].name + lVar17))
        ;
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x80;
      } while (uVar19 < *(ushort *)(local_40->padding + 2));
    }
    plVar16 = plStack_48;
    plVar13 = local_40;
    iVar7 = local_34[0];
    for (plVar11 = local_40->child; local_34[0] = iVar7, plVar11 != (lys_node *)0x0;
        plVar11 = plVar11->next) {
      if ((plVar11->parent == plVar13) &&
         (((plVar11->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN ||
          ((plVar11->flags & 0x40) == 0)))) {
        if (iVar7 == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        yin_print_snode(plVar16,iVar6,plVar11,0xe00);
        plVar13 = local_40;
      }
      iVar7 = local_34[0];
    }
    if (plVar13->nodetype == LYS_RPC) {
      pcVar15 = "rpc";
    }
    goto LAB_0019148c;
  }
  if ((int)LVar14 < 0x10) {
    switch(LVar14) {
    case LYS_CONTAINER:
      local_34[0] = 0;
      yin_print_open(out,level,(char *)0x0,"container","name",node->name,0);
      iVar6 = level + 1;
      yin_print_snode_common(out,iVar6,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out,">\n");
        }
        yin_print_when(out,iVar6,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_iffeature(plStack_48,iVar6,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      if (local_40->padding[1] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_must(plStack_48,iVar6,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[1]);
      }
      plVar16 = plStack_48;
      lVar3._0_2_ = local_40[1].flags;
      lVar3._2_1_ = local_40[1].ext_size;
      lVar3._3_1_ = local_40[1].iffeature_size;
      lVar3._4_1_ = local_40[1].padding[0];
      lVar3._5_1_ = local_40[1].padding[1];
      lVar3._6_1_ = local_40[1].padding[2];
      lVar3._7_1_ = local_40[1].padding[3];
      if (lVar3 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_substmt(plVar16,iVar6,LYEXT_SUBSTMT_PRESENCE,'\0',*(char **)&local_40[1].flags,
                          local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      yin_print_snode_common(plVar16,iVar6,local_40,local_40->module,local_34,0x74);
      if (*(short *)(local_40->padding + 2) != 0) {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_typedef(plStack_48,iVar6,local_40->module,(lys_tpdf *)(local_40[1].ref + lVar17)
                           );
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x80;
        } while (uVar19 < *(ushort *)(local_40->padding + 2));
      }
      plVar16 = plStack_48;
      plVar13 = local_40;
      for (plVar11 = local_40->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar11,0x800);
          plVar13 = local_40;
        }
      }
      for (plVar11 = plVar13->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar11,0x903f);
          plVar13 = local_40;
        }
      }
      for (plVar11 = plVar13->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar11,0x4000);
          plVar13 = local_40;
        }
      }
      iVar7 = local_34[0];
      for (plVar11 = plVar13->child; local_34[0] = iVar7, plVar11 != (lys_node *)0x0;
          plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (iVar7 == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar11,0x80);
          plVar13 = local_40;
        }
        iVar7 = local_34[0];
      }
      pcVar15 = "container";
      break;
    case LYS_CHOICE:
      local_34[0] = 0;
      yin_print_open(out,level,(char *)0x0,"choice","name",node->name,0);
      iVar6 = level + 1;
      yin_print_snode_common(out,iVar6,local_40,local_40->module,local_34,1);
      lVar4._0_1_ = local_40->hash[0];
      lVar4._1_1_ = local_40->hash[1];
      lVar4._2_1_ = local_40->hash[2];
      lVar4._3_1_ = local_40->hash[3];
      lVar4._4_4_ = *(undefined4 *)&local_40->field_0x6c;
      if (lVar4 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out,">\n");
        }
        yin_print_when(out,iVar6,local_40->module,*(lys_when **)local_40->hash);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_iffeature(plStack_48,iVar6,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      plVar16 = plStack_48;
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_substmt(plVar16,iVar6,LYEXT_SUBSTMT_DEFAULT,'\0',*(char **)local_40[1].name,
                          local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      yin_print_snode_common(plVar16,iVar6,local_40,local_40->module,local_34,0x7c);
      plVar13 = local_40;
      iVar7 = local_34[0];
      for (plVar11 = local_40->child; local_34[0] = iVar7, plVar11 != (lys_node *)0x0;
          plVar11 = plVar11->next) {
        if (plVar11->parent == plVar13) {
          if (iVar7 == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar11,0x807f);
          plVar13 = local_40;
        }
        iVar7 = local_34[0];
      }
      pcVar15 = "choice";
      break;
    default:
      goto switchD_0018f423_caseD_3;
    case LYS_LEAF:
      yin_print_open(out,level,(char *)0x0,"leaf","name",node->name,1);
      iVar6 = level + 1;
      if (local_40->ext_size != 0) {
        yin_print_extension_instances
                  (out,iVar6,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yin_print_when(out,iVar6,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_iffeature(out,iVar6,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      yin_print_type(out,iVar6,local_40->module,(lys_type *)&local_40[1].ref);
      yin_print_substmt(out,iVar6,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,local_40->module
                        ,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_must(out,iVar6,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[3]);
      }
      plVar11 = local_40[1].prev;
      if (plVar11 != (lys_node *)0x0) {
        if ((local_40->flags & 0x1000) != 0) {
          pcVar15 = strchr((char *)plVar11,0x3a);
          plVar13 = local_40;
          if (pcVar15 == (char *)0x0) {
            __assert_fail("strchr(leaf->dflt, \':\')",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                          ,0x45f,"void yin_print_leaf(struct lyout *, int, const struct lys_node *)"
                         );
          }
          plVar8 = lys_node_module(local_40);
          pcVar15 = plVar8->name;
          __s_00 = plVar13[1].prev;
          pcVar10 = strchr((char *)__s_00,0x3a);
          iVar7 = strncmp((char *)plVar11,pcVar15,(long)pcVar10 - (long)__s_00);
          plVar8 = plVar13->module;
          if (iVar7 == 0) {
            plVar11 = (lys_node *)lydict_insert(plVar8->ctx,pcVar10 + 1,0);
            out = plStack_48;
          }
          else {
            plVar11 = (lys_node *)transform_json2schema(plVar8,(char *)__s_00);
            out = plStack_48;
          }
        }
        yin_print_substmt(out,iVar6,LYEXT_SUBSTMT_DEFAULT,'\0',(char *)plVar11,local_40->module,
                          local_40->ext,(uint)local_40->ext_size);
        if ((local_40->flags & 0x1000) != 0) {
          lydict_remove(local_40->module->ctx,(char *)plVar11);
        }
      }
      yin_print_snode_common(out,iVar6,local_40,local_40->module,(int *)0x0,0x7c);
      pcVar15 = "leaf";
      uVar19 = (ulong)(uint)(level * 2);
      goto LAB_001915b1;
    case LYS_LEAFLIST:
      yin_print_open(out,level,(char *)0x0,"leaf-list","name",node->name,1);
      iVar6 = level + 1;
      if (local_40->ext_size != 0) {
        yin_print_extension_instances
                  (out,iVar6,local_40->module,LYEXT_SUBSTMT_SELF,'\0',local_40->ext,
                   (uint)local_40->ext_size);
      }
      if ((lys_when *)local_40[1].name != (lys_when *)0x0) {
        yin_print_when(plStack_48,iVar6,local_40->module,(lys_when *)local_40[1].name);
      }
      plVar16 = plStack_48;
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_iffeature(plVar16,iVar6,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      yin_print_type(plVar16,iVar6,local_40->module,(lys_type *)&local_40[1].ref);
      yin_print_substmt(plVar16,iVar6,LYEXT_SUBSTMT_UNITS,'\0',(char *)local_40[1].next,
                        local_40->module,local_40->ext,(uint)local_40->ext_size);
      if (local_40->padding[3] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          yin_print_must(plVar16,iVar6,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[3]);
      }
      if (local_40->padding[2] != '\0') {
        uVar19 = 0;
        do {
          plVar11 = local_40;
          if ((local_40->flags & 0x1000) == 0) {
            pcVar15 = *(char **)((local_40[1].prev)->padding + uVar19 * 8 + -0x1c);
          }
          else {
            pcVar15 = *(char **)((local_40[1].prev)->padding + uVar19 * 8 + -0x1c);
            pcVar10 = strchr(pcVar15,0x3a);
            if (pcVar10 == (char *)0x0) {
              __assert_fail("strchr(llist->dflt[i], \':\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                            ,0x4b3,
                            "void yin_print_leaflist(struct lyout *, int, const struct lys_node *)")
              ;
            }
            plVar8 = lys_node_module(plVar11);
            pcVar10 = plVar8->name;
            __s = *(char **)((plVar11[1].prev)->padding + uVar19 * 8 + -0x1c);
            pcVar12 = strchr(__s,0x3a);
            iVar7 = strncmp(pcVar15,pcVar10,(long)pcVar12 - (long)__s);
            if (iVar7 == 0) {
              pcVar15 = lydict_insert(plVar11->module->ctx,pcVar12 + 1,0);
            }
            else {
              pcVar15 = transform_json2schema(plVar11->module,__s);
            }
          }
          yin_print_substmt(plStack_48,iVar6,LYEXT_SUBSTMT_DEFAULT,(uint8_t)uVar19,pcVar15,
                            local_40->module,local_40->ext,(uint)local_40->ext_size);
          if ((local_40->flags & 0x1000) != 0) {
            lydict_remove(local_40->module->ctx,pcVar15);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < local_40->padding[2]);
      }
      plVar16 = plStack_48;
      yin_print_snode_common(plStack_48,iVar6,local_40,local_40->module,(int *)0x0,4);
      if (*(uint *)&local_40[1].priv != 0) {
        yin_print_unsigned(plVar16,iVar6,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,*(uint *)&local_40[1].priv);
      }
      uVar2 = *(uint *)((long)&local_40[1].priv + 4);
      if (uVar2 != 0) {
        yin_print_unsigned(plStack_48,iVar6,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,uVar2);
      }
      plVar11 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar7 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        out = plStack_48;
        if (iVar7 != -1) {
          pcVar15 = "system";
          goto LAB_00191201;
        }
      }
      else {
        pcVar15 = "user";
LAB_00191201:
        out = plStack_48;
        yin_print_substmt(plStack_48,iVar6,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar15,plVar11->module,
                          plVar11->ext,(uint)plVar11->ext_size);
      }
      yin_print_snode_common(out,iVar6,plVar11,plVar11->module,(int *)0x0,0x70);
      pcVar15 = "leaf-list";
      uVar19 = (ulong)(uint)(level * 2);
LAB_001915b1:
      ly_print(out,"%*s</%s>\n",uVar19,"",pcVar15);
      return;
    }
  }
  else if ((int)LVar14 < 0x40) {
    if (LVar14 == LYS_LIST) {
      local_34[0] = 0;
      yin_print_open(out,level,(char *)0x0,"list","name",node->name,0);
      iVar6 = level + 1;
      yin_print_snode_common(out,iVar6,local_40,local_40->module,local_34,1);
      if (local_40[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(out,">\n");
        }
        yin_print_when(out,iVar6,local_40->module,(lys_when *)local_40[1].name);
      }
      if (local_40->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_iffeature(plStack_48,iVar6,local_40->module,
                              (lys_iffeature *)((long)&local_40->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
        } while (uVar19 < local_40->iffeature_size);
      }
      if (local_40->padding[0] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
          }
          yin_print_must(plStack_48,iVar6,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
        } while (uVar19 < local_40->padding[0]);
      }
      plVar16 = plStack_48;
      if (local_40->padding[2] != '\0') {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_substmt(plVar16,iVar6,LYEXT_SUBSTMT_KEY,'\0',(char *)local_40[1].module,
                          local_40->module,local_40->ext,(uint)local_40->ext_size);
      }
      if (local_40->padding[3] != '\0') {
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_unique(plVar16,iVar6,local_40->module,
                           (lys_unique *)(local_40[1].ext + uVar19 * 2));
          plVar11 = local_40;
          iVar7 = -1;
          while (iVar7 = lys_ext_iter(plVar11->ext,plVar11->ext_size,(char)iVar7 + '\x01',
                                      LYEXT_SUBSTMT_UNIQUE), iVar7 != -1) {
            if (uVar19 == plVar11->ext[iVar7]->insubstmt_index) {
              ly_print(plVar16,">\n");
              plVar11 = local_40;
              do {
                yin_print_extension_instances
                          (plVar16,level + 2,plVar11->module,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar19,
                           plVar11->ext + iVar7,1);
                plVar11 = local_40;
                do {
                  iVar7 = lys_ext_iter(plVar11->ext,plVar11->ext_size,(char)iVar7 + '\x01',
                                       LYEXT_SUBSTMT_UNIQUE);
                  if (iVar7 == -1) {
                    iVar7 = 1;
                    goto LAB_00190fcf;
                  }
                } while (uVar19 != plVar11->ext[iVar7]->insubstmt_index);
              } while( true );
            }
          }
          iVar7 = 0;
LAB_00190fcf:
          yin_print_close(plVar16,iVar6,(char *)0x0,"unique",iVar7);
          uVar19 = uVar19 + 1;
        } while (uVar19 < local_40->padding[3]);
      }
      yin_print_snode_common(plVar16,iVar6,local_40,local_40->module,local_34,4);
      if (*(int *)&local_40[1].iffeature != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        yin_print_unsigned(plVar16,iVar6,LYEXT_SUBSTMT_MIN,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,*(uint *)&local_40[1].iffeature);
      }
      if (*(int *)((long)&local_40[1].iffeature + 4) != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        yin_print_unsigned(plVar16,iVar6,LYEXT_SUBSTMT_MAX,'\0',local_40->module,local_40->ext,
                           (uint)local_40->ext_size,*(uint *)((long)&local_40[1].iffeature + 4));
      }
      plVar11 = local_40;
      if ((local_40->flags & 0x100) == 0) {
        iVar7 = lys_ext_iter(local_40->ext,local_40->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
        if (iVar7 != -1) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          plVar8 = local_40->module;
          bVar1 = local_40->ext_size;
          pcVar15 = "system";
          goto LAB_00191298;
        }
      }
      else {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        plVar8 = local_40->module;
        bVar1 = local_40->ext_size;
        pcVar15 = "user";
LAB_00191298:
        plVar11 = local_40;
        yin_print_substmt(plVar16,iVar6,LYEXT_SUBSTMT_ORDEREDBY,'\0',pcVar15,plVar8,local_40->ext,
                          (uint)bVar1);
      }
      yin_print_snode_common(plVar16,iVar6,plVar11,plVar11->module,local_34,0x70);
      if (plVar11->padding[1] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
            plVar11 = local_40;
          }
          yin_print_typedef(plStack_48,iVar6,plVar11->module,(lys_tpdf *)(plVar11[1].ref + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x80;
          plVar11 = local_40;
        } while (uVar19 < local_40->padding[1]);
      }
      plVar16 = plStack_48;
      for (plVar13 = plVar11->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar13,0x800);
          plVar11 = local_40;
        }
      }
      for (plVar13 = plVar11->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar13,0x903f);
          plVar11 = local_40;
        }
      }
      for (plVar13 = plVar11->child; plVar13 != (lys_node *)0x0; plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar13,0x4000);
          plVar11 = local_40;
        }
      }
      iVar7 = local_34[0];
      for (plVar13 = plVar11->child; local_34[0] = iVar7, plVar13 != (lys_node *)0x0;
          plVar13 = plVar13->next) {
        if (plVar13->parent == plVar11) {
          if (iVar7 == 0) {
            local_34[0] = 1;
            ly_print(plVar16,">\n");
          }
          yin_print_snode(plVar16,iVar6,plVar13,0x80);
          plVar11 = local_40;
        }
        iVar7 = local_34[0];
      }
      pcVar15 = "list";
    }
    else {
      if (LVar14 != LYS_ANYXML) {
        return;
      }
LAB_0018fe97:
      local_34[0] = 0;
      plVar11 = lys_parent(node);
      if (((plVar11 == (lys_node *)0x0) && (iVar6 = strcmp(node->name,"config"), iVar6 == 0)) &&
         (iVar6 = strcmp(node->module->name,"ietf-netconf"), iVar6 == 0)) {
        return;
      }
      plVar16 = plStack_48;
      pcVar15 = "anydata";
      if (node->nodetype == LYS_ANYXML) {
        pcVar15 = "anyxml";
      }
      yin_print_open(plStack_48,level,(char *)0x0,pcVar15,"name",node->name,local_34[0]);
      iVar6 = level + 1;
      yin_print_snode_common(plVar16,iVar6,node,node->module,local_34,1);
      if (node[1].name != (char *)0x0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
          node = local_40;
        }
        yin_print_when(plVar16,iVar6,node->module,(lys_when *)node[1].name);
        node = local_40;
      }
      if (node->iffeature_size != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
            node = local_40;
          }
          yin_print_iffeature(plStack_48,iVar6,node->module,
                              (lys_iffeature *)((long)&node->iffeature->expr + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x20;
          node = local_40;
        } while (uVar19 < local_40->iffeature_size);
      }
      if (node->padding[3] != '\0') {
        lVar17 = 0;
        uVar19 = 0;
        do {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            ly_print(plStack_48,">\n");
            node = local_40;
          }
          yin_print_must(plStack_48,iVar6,node->module,(lys_restr *)(node[1].dsc + lVar17));
          uVar19 = uVar19 + 1;
          lVar17 = lVar17 + 0x38;
          node = local_40;
        } while (uVar19 < local_40->padding[3]);
      }
      plVar16 = plStack_48;
      yin_print_snode_common(plStack_48,iVar6,node,node->module,local_34,0x7c);
      iVar7 = local_34[0];
    }
  }
  else if (LVar14 == LYS_CASE) {
    local_34[0] = 0;
    if ((node->flags & 0x40) == 0) {
      yin_print_open(out,level,(char *)0x0,"case","name",node->name,0);
      level = level + 1;
      yin_print_snode_common(out,level,local_40,local_40->module,local_34,1);
      lVar5._0_1_ = local_40->hash[0];
      lVar5._1_1_ = local_40->hash[1];
      lVar5._2_1_ = local_40->hash[2];
      lVar5._3_1_ = local_40->hash[3];
      lVar5._4_4_ = *(undefined4 *)&local_40->field_0x6c;
      if (lVar5 != 0) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        out = plStack_48;
        yin_print_when(plStack_48,level,local_40->module,*(lys_when **)local_40->hash);
      }
      yin_print_snode_common(out,level,local_40,local_40->module,local_34,0x72);
    }
    else {
      local_34[0] = 1;
    }
    plVar13 = local_40;
    iVar7 = local_34[0];
    for (plVar11 = local_40->child; local_34[0] = iVar7, plVar11 != (lys_node *)0x0;
        plVar11 = plVar11->next) {
      if (plVar11->parent == plVar13) {
        if (iVar7 == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_snode(plStack_48,level,plVar11,0x903f);
        plVar13 = local_40;
      }
      iVar7 = local_34[0];
    }
    if ((plVar13->flags & 0x40) != 0) {
      return;
    }
    level = level + -1;
    pcVar15 = "case";
    plVar16 = plStack_48;
  }
  else {
    if (LVar14 != LYS_NOTIF) {
      return;
    }
    local_34[0] = 0;
    yin_print_open(out,level,(char *)0x0,"notification","name",node->name,0);
    iVar6 = level + 1;
    yin_print_snode_common(out,iVar6,local_40,local_40->module,local_34,3);
    if (local_40->padding[1] != '\0') {
      lVar17 = 0;
      uVar19 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_must(plStack_48,iVar6,local_40->module,(lys_restr *)(local_40[1].dsc + lVar17));
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x38;
      } while (uVar19 < local_40->padding[1]);
    }
    yin_print_snode_common(plStack_48,iVar6,local_40,local_40->module,local_34,0x70);
    if (*(short *)(local_40->padding + 2) != 0) {
      lVar17 = 0;
      uVar19 = 0;
      do {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plStack_48,">\n");
        }
        yin_print_typedef(plStack_48,iVar6,local_40->module,(lys_tpdf *)(local_40[1].name + lVar17))
        ;
        uVar19 = uVar19 + 1;
        lVar17 = lVar17 + 0x80;
      } while (uVar19 < *(ushort *)(local_40->padding + 2));
    }
    plVar16 = plStack_48;
    plVar13 = local_40;
    for (plVar11 = local_40->child; plVar11 != (lys_node *)0x0; plVar11 = plVar11->next) {
      if (plVar11->parent == plVar13) {
        if (local_34[0] == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        yin_print_snode(plVar16,iVar6,plVar11,0x800);
        plVar13 = local_40;
      }
    }
    iVar7 = local_34[0];
    for (plVar11 = plVar13->child; local_34[0] = iVar7, plVar11 != (lys_node *)0x0;
        plVar11 = plVar11->next) {
      if (plVar11->parent == plVar13) {
        if (iVar7 == 0) {
          local_34[0] = 1;
          ly_print(plVar16,">\n");
        }
        yin_print_snode(plVar16,iVar6,plVar11,0x903f);
        plVar13 = local_40;
      }
      iVar7 = local_34[0];
    }
    pcVar15 = "notification";
  }
LAB_0019148c:
  yin_print_close(plVar16,level,(char *)0x0,pcVar15,iVar7);
switchD_0018f423_caseD_3:
  return;
}

Assistant:

static void
yin_print_snode(struct lyout *out, int level, const struct lys_node *node, int mask)
{
    switch (node->nodetype & mask) {
    case LYS_CONTAINER:
        yin_print_container(out, level, node);
        break;
    case LYS_CHOICE:
        yin_print_choice(out, level, node);
        break;
    case LYS_LEAF:
        yin_print_leaf(out, level, node);
        break;
    case LYS_LEAFLIST:
        yin_print_leaflist(out, level, node);
        break;
    case LYS_LIST:
        yin_print_list(out, level, node);
        break;
    case LYS_USES:
        yin_print_uses(out, level, node);
        break;
    case LYS_GROUPING:
        yin_print_grouping(out, level, node);
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        yin_print_anydata(out, level, node);
        break;
    case LYS_CASE:
        yin_print_case(out, level, node);
        break;
    case LYS_RPC:
    case LYS_ACTION:
        yin_print_rpc_action(out, level, node);
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        yin_print_input_output(out, level, node);
        break;
    case LYS_NOTIF:
        yin_print_notif(out, level, node);
        break;
    default:
        break;
    }
}